

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.cpp
# Opt level: O0

void eastl::RBTreeInsert(rbtree_node_base *pNode,rbtree_node_base *pNodeParent,
                        rbtree_node_base *pNodeAnchor,RBTreeSide insertionSide)

{
  this_type *ptVar1;
  this_type **pptVar2;
  rbtree_node_base *prVar3;
  rbtree_node_base *prVar4;
  bool bVar5;
  rbtree_node_base *pNodeTemp_1;
  rbtree_node_base *pNodeTemp;
  rbtree_node_base *pNodeParentParent;
  rbtree_node_base **pNodeRootRef;
  RBTreeSide insertionSide_local;
  rbtree_node_base *pNodeAnchor_local;
  rbtree_node_base *pNodeParent_local;
  rbtree_node_base *pNode_local;
  
  pptVar2 = &pNodeAnchor->mpNodeParent;
  pNode->mpNodeParent = pNodeParent;
  pNode->mpNodeRight = (this_type *)0x0;
  pNode->mpNodeLeft = (this_type *)0x0;
  pNode->mColor = '\0';
  if (insertionSide == kRBTreeSideLeft) {
    pNodeParent->mpNodeLeft = pNode;
    if (pNodeParent == pNodeAnchor) {
      pNodeAnchor->mpNodeParent = pNode;
      pNodeAnchor->mpNodeRight = pNode;
      pNodeParent_local = pNode;
    }
    else {
      pNodeParent_local = pNode;
      if (pNodeParent == pNodeAnchor->mpNodeLeft) {
        pNodeAnchor->mpNodeLeft = pNode;
        pNodeParent_local = pNode;
      }
    }
  }
  else {
    pNodeParent->mpNodeRight = pNode;
    pNodeParent_local = pNode;
    if (pNodeParent == pNodeAnchor->mpNodeRight) {
      pNodeAnchor->mpNodeRight = pNode;
      pNodeParent_local = pNode;
    }
  }
  while( true ) {
    bVar5 = false;
    if (pNodeParent_local != *pptVar2) {
      bVar5 = pNodeParent_local->mpNodeParent->mColor == '\0';
    }
    if (!bVar5) break;
    prVar4 = pNodeParent_local->mpNodeParent->mpNodeParent;
    if (pNodeParent_local->mpNodeParent == prVar4->mpNodeLeft) {
      ptVar1 = prVar4->mpNodeRight;
      if ((ptVar1 == (this_type *)0x0) || (ptVar1->mColor != '\0')) {
        if (pNodeParent_local == pNodeParent_local->mpNodeParent->mpNodeRight) {
          pNodeParent_local = pNodeParent_local->mpNodeParent;
          prVar3 = RBTreeRotateLeft(pNodeParent_local,*pptVar2);
          *pptVar2 = prVar3;
        }
        pNodeParent_local->mpNodeParent->mColor = '\x01';
        prVar4->mColor = '\0';
        prVar4 = RBTreeRotateRight(prVar4,*pptVar2);
        *pptVar2 = prVar4;
      }
      else {
        pNodeParent_local->mpNodeParent->mColor = '\x01';
        ptVar1->mColor = '\x01';
        prVar4->mColor = '\0';
        pNodeParent_local = prVar4;
      }
    }
    else {
      ptVar1 = prVar4->mpNodeLeft;
      if ((ptVar1 == (this_type *)0x0) || (ptVar1->mColor != '\0')) {
        if (pNodeParent_local == pNodeParent_local->mpNodeParent->mpNodeLeft) {
          pNodeParent_local = pNodeParent_local->mpNodeParent;
          prVar3 = RBTreeRotateRight(pNodeParent_local,*pptVar2);
          *pptVar2 = prVar3;
        }
        pNodeParent_local->mpNodeParent->mColor = '\x01';
        prVar4->mColor = '\0';
        prVar4 = RBTreeRotateLeft(prVar4,*pptVar2);
        *pptVar2 = prVar4;
      }
      else {
        pNodeParent_local->mpNodeParent->mColor = '\x01';
        ptVar1->mColor = '\x01';
        prVar4->mColor = '\0';
        pNodeParent_local = prVar4;
      }
    }
  }
  (*pptVar2)->mColor = '\x01';
  return;
}

Assistant:

EASTL_API void RBTreeInsert(rbtree_node_base* pNode,
                                rbtree_node_base* pNodeParent, 
                                rbtree_node_base* pNodeAnchor,
                                RBTreeSide insertionSide)
    {
        rbtree_node_base*& pNodeRootRef = pNodeAnchor->mpNodeParent;

        // Initialize fields in new node to insert.
        pNode->mpNodeParent = pNodeParent;
        pNode->mpNodeRight  = NULL;
        pNode->mpNodeLeft   = NULL;
        pNode->mColor       = kRBTreeColorRed;

        // Insert the node.
        if(insertionSide == kRBTreeSideLeft)
        {
            pNodeParent->mpNodeLeft = pNode; // Also makes (leftmost = pNode) when (pNodeParent == pNodeAnchor)

            if(pNodeParent == pNodeAnchor)
            {
                pNodeAnchor->mpNodeParent = pNode;
                pNodeAnchor->mpNodeRight = pNode;
            }
            else if(pNodeParent == pNodeAnchor->mpNodeLeft)
                pNodeAnchor->mpNodeLeft = pNode; // Maintain leftmost pointing to min node
        }
        else
        {
            pNodeParent->mpNodeRight = pNode;

            if(pNodeParent == pNodeAnchor->mpNodeRight)
                pNodeAnchor->mpNodeRight = pNode; // Maintain rightmost pointing to max node
        }

        // Rebalance the tree.
        while((pNode != pNodeRootRef) && (pNode->mpNodeParent->mColor == kRBTreeColorRed)) 
        {
            rbtree_node_base* const pNodeParentParent = pNode->mpNodeParent->mpNodeParent;

            if(pNode->mpNodeParent == pNodeParentParent->mpNodeLeft) 
            {
                rbtree_node_base* const pNodeTemp = pNodeParentParent->mpNodeRight;

                if(pNodeTemp && (pNodeTemp->mColor == kRBTreeColorRed)) 
                {
                    pNode->mpNodeParent->mColor = kRBTreeColorBlack;
                    pNodeTemp->mColor = kRBTreeColorBlack;
                    pNodeParentParent->mColor = kRBTreeColorRed;
                    pNode = pNodeParentParent;
                }
                else 
                {
                    if(pNode == pNode->mpNodeParent->mpNodeRight) 
                    {
                        pNode = pNode->mpNodeParent;
                        pNodeRootRef = RBTreeRotateLeft(pNode, pNodeRootRef);
                    }

                    pNode->mpNodeParent->mColor = kRBTreeColorBlack;
                    pNodeParentParent->mColor = kRBTreeColorRed;
                    pNodeRootRef = RBTreeRotateRight(pNodeParentParent, pNodeRootRef);
                }
            }
            else 
            {
                rbtree_node_base* const pNodeTemp = pNodeParentParent->mpNodeLeft;

                if(pNodeTemp && (pNodeTemp->mColor == kRBTreeColorRed)) 
                {
                    pNode->mpNodeParent->mColor = kRBTreeColorBlack;
                    pNodeTemp->mColor = kRBTreeColorBlack;
                    pNodeParentParent->mColor = kRBTreeColorRed;
                    pNode = pNodeParentParent;
                }
                else 
                {
                    if(pNode == pNode->mpNodeParent->mpNodeLeft) 
                    {
                        pNode = pNode->mpNodeParent;
                        pNodeRootRef = RBTreeRotateRight(pNode, pNodeRootRef);
                    }

                    pNode->mpNodeParent->mColor = kRBTreeColorBlack;
                    pNodeParentParent->mColor = kRBTreeColorRed;
                    pNodeRootRef = RBTreeRotateLeft(pNodeParentParent, pNodeRootRef);
                }
            }
        }

        pNodeRootRef->mColor = kRBTreeColorBlack;

    }